

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int *piVar1;
  undefined1 (*pauVar2) [16];
  uint *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  parasail_result_t *ppVar18;
  __m128i *palVar19;
  __m128i *ptr;
  __m128i *b;
  __m128i *palVar20;
  __m128i *palVar21;
  __m128i *ptr_00;
  __m128i *palVar22;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  int32_t *ptr_03;
  uint uVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  long lVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  ushort uVar41;
  int iVar42;
  long lVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ulong uVar48;
  uint uVar49;
  int iVar50;
  uint uVar53;
  int iVar54;
  uint uVar55;
  int iVar56;
  uint uVar57;
  int iVar58;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint uVar59;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar66;
  uint uVar73;
  uint uVar75;
  uint uVar78;
  undefined1 auVar68 [16];
  int iVar67;
  int iVar74;
  int iVar76;
  int iVar79;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ulong uVar77;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar82;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  uint uVar89;
  undefined1 auVar88 [16];
  int iVar91;
  undefined1 auVar90 [16];
  int iVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  int iVar95;
  int iVar96;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  undefined1 auVar97 [16];
  int iVar103;
  uint uVar104;
  uint uVar105;
  uint uVar106;
  uint uVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i_32_t e;
  __m128i_32_t h;
  uint local_244;
  int local_240;
  __m128i *local_220;
  __m128i *local_218;
  __m128i *local_210;
  __m128i *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_198;
  undefined8 uStack_190;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  size_t len;
  longlong extraout_RDX_00;
  int32_t iVar60;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar17 = profile->s1Len;
        if ((int)uVar17 < 1) {
          parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_4();
        }
        else {
          uVar33 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_1();
          }
          else {
            iVar42 = uVar17 - 1;
            uVar77 = (ulong)uVar17 + 3;
            uVar40 = uVar77 >> 2;
            uVar39 = (uint)uVar40;
            iVar13 = iVar42 / (int)uVar39;
            uVar25 = iVar42 % (int)uVar39;
            uVar34 = -open;
            uVar14 = ppVar6->min;
            uVar16 = 0x80000000 - uVar14;
            if (uVar14 != uVar34 && SBORROW4(uVar14,uVar34) == (int)(uVar14 + open) < 0) {
              uVar16 = open | 0x80000000;
            }
            pvVar7 = (profile->profile32).matches;
            uVar14 = 0x7ffffffe - ppVar6->max;
            pvVar8 = (profile->profile32).similar;
            ppVar18 = parasail_result_new_table3((uint)uVar77 & 0x7ffffffc,s2Len);
            if (ppVar18 != (parasail_result_t *)0x0) {
              ppVar18->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar18->flag | 0x4430802;
              palVar19 = parasail_memalign___m128i(0x10,uVar40);
              ptr = parasail_memalign___m128i(0x10,uVar40);
              b = parasail_memalign___m128i(0x10,uVar40);
              uStack_1f0 = local_1f8;
              local_1f8 = b;
              palVar20 = parasail_memalign___m128i(0x10,uVar40);
              palVar21 = parasail_memalign___m128i(0x10,uVar40);
              ptr_00 = parasail_memalign___m128i(0x10,uVar40);
              palVar22 = parasail_memalign___m128i(0x10,uVar40);
              ptr_01 = parasail_memalign___m128i(0x10,uVar40);
              ptr_02 = parasail_memalign___m128i(0x10,uVar40);
              b_00 = parasail_memalign___m128i(0x10,uVar40);
              b_01 = parasail_memalign___m128i(0x10,uVar40);
              b_02 = parasail_memalign___m128i(0x10,uVar40);
              ptr_03 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (b_01 == (__m128i *)0x0 ||
                           (b_00 == (__m128i *)0x0 ||
                           (ptr_02 == (__m128i *)0x0 || ptr_01 == (__m128i *)0x0))) ||
                           ((palVar22 == (__m128i *)0x0 ||
                            (ptr_00 == (__m128i *)0x0 || palVar21 == (__m128i *)0x0)) ||
                           ((palVar20 == (__m128i *)0x0 || b == (__m128i *)0x0) ||
                           (ptr == (__m128i *)0x0 || palVar19 == (__m128i *)0x0)));
              uVar38 = 0;
              if ((ptr_03 != (int32_t *)0x0 && b_02 != (__m128i *)0x0) &&
                  ((b_01 != (__m128i *)0x0 &&
                   (b_00 != (__m128i *)0x0 && (ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0)
                   )) && ((palVar22 != (__m128i *)0x0 &&
                          (ptr_00 != (__m128i *)0x0 && palVar21 != (__m128i *)0x0)) &&
                         ((palVar20 != (__m128i *)0x0 && b != (__m128i *)0x0) &&
                         (ptr != (__m128i *)0x0 && palVar19 != (__m128i *)0x0))))) {
                iVar15 = s2Len + -1;
                uVar23 = 3 - iVar13;
                len = (size_t)uVar23;
                uVar16 = uVar16 + 1;
                c[0] = uVar40;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar40;
                parasail_memset___m128i(palVar21,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = uVar40;
                parasail_memset___m128i(palVar22,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = uVar40;
                parasail_memset___m128i(b_00,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = uVar40;
                parasail_memset___m128i(b_01,c_03,len);
                c_04[1] = extraout_RDX_04;
                c_04[0] = uVar40;
                parasail_memset___m128i(b_02,c_04,len);
                uVar28 = uVar34;
                do {
                  lVar31 = 0;
                  auVar51._12_4_ = uVar28;
                  do {
                    uVar82 = 0;
                    if (s1_beg == 0) {
                      uVar82 = auVar51._12_4_;
                    }
                    *(uint *)((long)&local_48 + lVar31 * 4) = uVar82;
                    lVar35 = (long)(int)uVar82 - (ulong)(uint)open;
                    if (lVar35 < -0x7fffffff) {
                      lVar35 = -0x80000000;
                    }
                    *(int *)((long)&local_58 + lVar31 * 4) = (int)lVar35;
                    lVar31 = lVar31 + 1;
                    auVar51._12_4_ = auVar51._12_4_ - gap * uVar39;
                  } while (lVar31 != 4);
                  palVar19[uVar38][0] = local_48;
                  palVar19[uVar38][1] = lStack_40;
                  ptr_02[uVar38][0] = local_58;
                  ptr_02[uVar38][1] = lStack_50;
                  uVar38 = uVar38 + 1;
                  uVar28 = uVar28 - gap;
                } while (uVar38 != uVar40);
                *ptr_03 = 0;
                uVar38 = 1;
                uVar28 = uVar34;
                do {
                  auVar51._12_4_ = 0;
                  if (s2_beg == 0) {
                    auVar51._12_4_ = uVar28;
                  }
                  ptr_03[uVar38] = auVar51._12_4_;
                  uVar38 = uVar38 + 1;
                  uVar28 = uVar28 - gap;
                } while (s2Len + 1 != uVar38);
                uVar28 = uVar39 - 1;
                uVar38 = uVar33;
                if (s2Len < 2) {
                  uVar38 = 1;
                }
                lVar35 = uVar40 * uVar33;
                lVar31 = lVar35 * 4;
                lVar37 = lVar35 * 8;
                lVar35 = lVar35 * 0xc;
                lVar32 = (ulong)(uVar39 + (uVar39 == 0)) << 4;
                lVar30 = 0;
                uVar36 = 0;
                auVar51._4_4_ = uVar16;
                auVar51._0_4_ = uVar16;
                auVar51._8_4_ = uVar16;
                auVar51._12_4_ = uVar16;
                auVar61 = auVar51;
                auVar72 = auVar51;
                auVar80 = auVar51;
                auVar88 = auVar51;
                uVar82 = uVar14;
                uVar83 = uVar14;
                uVar84 = uVar14;
                uVar85 = uVar14;
                local_240 = iVar15;
                do {
                  local_200 = ptr;
                  local_210 = palVar20;
                  local_218 = ptr_00;
                  local_220 = ptr_01;
                  ptr = palVar19;
                  ptr_01 = palVar22;
                  ptr_00 = palVar21;
                  palVar20 = local_1f8;
                  palVar21 = ptr + uVar28;
                  palVar22 = local_1f8 + uVar28;
                  iVar92 = (int)(*palVar22)[0];
                  iVar103 = *(int *)((long)*palVar22 + 4);
                  iVar91 = (int)(*palVar22)[1];
                  palVar22 = ptr_00 + uVar28;
                  iVar54 = (int)(*palVar22)[0];
                  iVar56 = *(int *)((long)*palVar22 + 4);
                  iVar58 = (int)(*palVar22)[1];
                  palVar22 = ptr_01 + uVar28;
                  iVar98 = (int)(*palVar22)[0];
                  iVar100 = *(int *)((long)*palVar22 + 4);
                  iVar102 = (int)(*palVar22)[1];
                  iVar101 = 0;
                  iVar50 = 0;
                  iVar95 = 0;
                  palVar22 = ptr + uVar28;
                  iVar26 = (int)(*palVar22)[0];
                  iVar96 = *(int *)((long)*palVar22 + 4);
                  iVar99 = (int)(*palVar22)[1];
                  iVar60 = ptr_03[uVar36];
                  lVar27 = (long)ppVar6->mapper[(byte)s2[uVar36]] * uVar40 * 0x10;
                  auVar108 = ZEXT816(0);
                  lVar29 = 0;
                  auVar111 = ZEXT816(0);
                  lVar24 = lVar30;
                  auVar109 = _DAT_008d0f00;
                  uVar104 = uVar16;
                  uVar105 = uVar16;
                  uVar106 = uVar16;
                  uVar107 = uVar16;
                  do {
                    piVar1 = (int *)((long)pvVar5 + lVar29 + lVar27);
                    uVar59 = iVar60 + *piVar1;
                    uVar63 = iVar26 + piVar1[1];
                    uVar64 = iVar96 + piVar1[2];
                    uVar65 = iVar99 + piVar1[3];
                    piVar1 = (int *)((long)*ptr_02 + lVar29);
                    iVar67 = *piVar1;
                    iVar74 = piVar1[1];
                    iVar76 = piVar1[2];
                    iVar79 = piVar1[3];
                    uVar66 = (uint)((int)uVar59 < iVar67) * iVar67 |
                             ((int)uVar59 >= iVar67) * uVar59;
                    uVar73 = (uint)((int)uVar63 < iVar74) * iVar74 |
                             ((int)uVar63 >= iVar74) * uVar63;
                    uVar75 = (uint)((int)uVar64 < iVar76) * iVar76 |
                             ((int)uVar64 >= iVar76) * uVar64;
                    uVar78 = (uint)((int)uVar65 < iVar79) * iVar79 |
                             ((int)uVar65 >= iVar79) * uVar65;
                    uVar49 = ((int)uVar66 < (int)uVar104) * uVar104 |
                             ((int)uVar66 >= (int)uVar104) * uVar66;
                    uVar53 = ((int)uVar73 < (int)uVar105) * uVar105 |
                             ((int)uVar73 >= (int)uVar105) * uVar73;
                    uVar55 = ((int)uVar75 < (int)uVar106) * uVar106 |
                             ((int)uVar75 >= (int)uVar106) * uVar75;
                    uVar57 = ((int)uVar78 < (int)uVar107) * uVar107 |
                             ((int)uVar78 >= (int)uVar107) * uVar78;
                    auVar71 = *(undefined1 (*) [16])((long)*b_00 + lVar29);
                    auVar69 = *(undefined1 (*) [16])((long)*b_01 + lVar29);
                    pauVar2 = (undefined1 (*) [16])((long)*b_02 + lVar29);
                    uVar10 = *(undefined8 *)*pauVar2;
                    uVar11 = *(undefined8 *)(*pauVar2 + 8);
                    auVar86 = *pauVar2;
                    puVar3 = (uint *)((long)*local_200 + lVar29);
                    *puVar3 = uVar49;
                    puVar3[1] = uVar53;
                    puVar3[2] = uVar55;
                    puVar3[3] = uVar57;
                    auVar68._0_4_ = -(uint)((int)uVar104 < (int)uVar66);
                    auVar68._4_4_ = -(uint)((int)uVar105 < (int)uVar73);
                    auVar68._8_4_ = -(uint)((int)uVar106 < (int)uVar75);
                    auVar68._12_4_ = -(uint)((int)uVar107 < (int)uVar78);
                    auVar93 = blendvps(auVar111,auVar71,auVar68);
                    piVar1 = (int *)((long)pvVar7 + lVar29 + lVar27);
                    auVar94._0_4_ = iVar101 + *piVar1;
                    auVar94._4_4_ = iVar92 + piVar1[1];
                    auVar94._8_4_ = iVar103 + piVar1[2];
                    auVar94._12_4_ = iVar91 + piVar1[3];
                    auVar112._0_4_ = -(uint)(uVar59 == uVar49);
                    auVar112._4_4_ = -(uint)(uVar63 == uVar53);
                    auVar112._8_4_ = -(uint)(uVar64 == uVar55);
                    auVar112._12_4_ = -(uint)(uVar65 == uVar57);
                    auVar94 = blendvps(auVar93,auVar94,auVar112);
                    *(undefined1 (*) [16])((long)*local_210 + lVar29) = auVar94;
                    auVar93 = blendvps(auVar108,auVar69,auVar68);
                    piVar1 = (int *)((long)pvVar8 + lVar29 + lVar27);
                    auVar90._0_4_ = iVar50 + *piVar1;
                    auVar90._4_4_ = iVar54 + piVar1[1];
                    auVar90._8_4_ = iVar56 + piVar1[2];
                    auVar90._12_4_ = iVar58 + piVar1[3];
                    auVar90 = blendvps(auVar93,auVar90,auVar112);
                    *(undefined1 (*) [16])((long)*local_218 + lVar29) = auVar90;
                    auVar86 = blendvps(auVar109,auVar86,auVar68);
                    auVar97._0_4_ = iVar95 + 1;
                    auVar97._4_4_ = iVar98 + 1;
                    auVar97._8_4_ = iVar100 + 1;
                    auVar97._12_4_ = iVar102 + 1;
                    auVar86 = blendvps(auVar86,auVar97,auVar112);
                    *(undefined1 (*) [16])((long)*local_220 + lVar29) = auVar86;
                    lVar43 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 8);
                    iVar92 = auVar94._0_4_;
                    *(int *)(lVar43 + lVar24) = iVar92;
                    lVar43 = lVar43 + lVar24;
                    uVar9 = extractps(auVar94,1);
                    *(undefined8 *)(lVar31 + lVar43) = uVar9;
                    uVar9 = extractps(auVar94,2);
                    *(undefined8 *)(lVar37 + lVar43) = uVar9;
                    uVar9 = extractps(auVar94,3);
                    *(undefined8 *)(lVar35 + lVar43) = uVar9;
                    lVar43 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x10);
                    iVar99 = auVar90._0_4_;
                    *(int *)(lVar43 + lVar24) = iVar99;
                    lVar43 = lVar43 + lVar24;
                    uVar9 = extractps(auVar90,1);
                    *(undefined8 *)(lVar31 + lVar43) = uVar9;
                    uVar9 = extractps(auVar90,2);
                    *(undefined8 *)(lVar37 + lVar43) = uVar9;
                    uVar9 = extractps(auVar90,3);
                    *(undefined8 *)(lVar35 + lVar43) = uVar9;
                    lVar43 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x18);
                    iVar101 = auVar86._0_4_;
                    *(int *)(lVar43 + lVar24) = iVar101;
                    lVar43 = lVar43 + lVar24;
                    uVar9 = extractps(auVar86,1);
                    *(undefined8 *)(lVar31 + lVar43) = uVar9;
                    uVar9 = extractps(auVar86,2);
                    *(undefined8 *)(lVar37 + lVar43) = uVar9;
                    uVar9 = extractps(auVar86,3);
                    *(undefined8 *)(lVar35 + lVar43) = uVar9;
                    lVar43 = *((ppVar18->field_4).trace)->trace_del_table;
                    *(uint *)(lVar43 + lVar24) = uVar49;
                    lVar43 = lVar43 + lVar24;
                    *(uint *)(lVar31 + lVar43) = uVar53;
                    *(uint *)(lVar37 + lVar43) = uVar55;
                    *(uint *)(lVar35 + lVar43) = uVar57;
                    uVar82 = ((int)uVar49 < (int)uVar82) * uVar49 |
                             ((int)uVar49 >= (int)uVar82) * uVar82;
                    uVar83 = ((int)uVar53 < (int)uVar83) * uVar53 |
                             ((int)uVar53 >= (int)uVar83) * uVar83;
                    uVar84 = ((int)uVar55 < (int)uVar84) * uVar55 |
                             ((int)uVar55 >= (int)uVar84) * uVar84;
                    uVar85 = ((int)uVar57 < (int)uVar85) * uVar57 |
                             ((int)uVar57 >= (int)uVar85) * uVar85;
                    iVar26 = auVar80._0_4_;
                    uVar59 = (iVar26 < (int)uVar49) * uVar49 |
                             (uint)(iVar26 >= (int)uVar49) * iVar26;
                    iVar26 = auVar80._4_4_;
                    uVar64 = (iVar26 < (int)uVar53) * uVar53 |
                             (uint)(iVar26 >= (int)uVar53) * iVar26;
                    iVar26 = auVar80._8_4_;
                    iVar96 = auVar80._12_4_;
                    uVar66 = (iVar26 < (int)uVar55) * uVar55 |
                             (uint)(iVar26 >= (int)uVar55) * iVar26;
                    uVar75 = (iVar96 < (int)uVar57) * uVar57 |
                             (uint)(iVar96 >= (int)uVar57) * iVar96;
                    uVar63 = (uint)(iVar99 < iVar101) * iVar101 | (uint)(iVar99 >= iVar101) * iVar99
                    ;
                    iVar26 = auVar86._4_4_;
                    iVar96 = auVar90._4_4_;
                    uVar65 = (uint)(iVar96 < iVar26) * iVar26 | (uint)(iVar96 >= iVar26) * iVar96;
                    iVar96 = auVar86._8_4_;
                    iVar99 = auVar90._8_4_;
                    iVar50 = auVar90._12_4_;
                    uVar73 = (uint)(iVar99 < iVar96) * iVar96 | (uint)(iVar99 >= iVar96) * iVar99;
                    iVar99 = auVar86._12_4_;
                    uVar78 = (uint)(iVar50 < iVar99) * iVar99 | (uint)(iVar50 >= iVar99) * iVar50;
                    iVar50 = uVar49 - open;
                    iVar54 = uVar53 - open;
                    iVar56 = uVar55 - open;
                    iVar58 = uVar57 - open;
                    iVar67 = iVar67 - gap;
                    iVar74 = iVar74 - gap;
                    iVar76 = iVar76 - gap;
                    iVar79 = iVar79 - gap;
                    auVar86._0_4_ = -(uint)(iVar67 < iVar50);
                    auVar86._4_4_ = -(uint)(iVar74 < iVar54);
                    auVar86._8_4_ = -(uint)(iVar76 < iVar56);
                    auVar86._12_4_ = -(uint)(iVar79 < iVar58);
                    auVar112 = blendvps(auVar71,auVar94,auVar86);
                    auVar69 = blendvps(auVar69,auVar90,auVar86);
                    local_1f8._0_4_ = (int)uVar10;
                    local_1f8._4_4_ = (int)((ulong)uVar10 >> 0x20);
                    uStack_1f0._0_4_ = (int)uVar11;
                    uStack_1f0._4_4_ = (int)((ulong)uVar11 >> 0x20);
                    auVar93._0_4_ = (int)local_1f8 + 1;
                    auVar93._4_4_ = local_1f8._4_4_ + 1;
                    auVar93._8_4_ = (int)uStack_1f0 + 1;
                    auVar93._12_4_ = uStack_1f0._4_4_ + 1;
                    auVar87._0_4_ = iVar101 + 1;
                    auVar87._4_4_ = iVar26 + 1;
                    auVar87._8_4_ = iVar96 + 1;
                    auVar87._12_4_ = iVar99 + 1;
                    auVar86 = blendvps(auVar93,auVar87,auVar86);
                    iVar96 = uVar104 - gap;
                    iVar99 = uVar105 - gap;
                    iVar101 = uVar106 - gap;
                    iVar103 = uVar107 - gap;
                    auVar71._0_4_ = -(uint)(iVar96 < iVar50);
                    auVar71._4_4_ = -(uint)(iVar99 < iVar54);
                    auVar71._8_4_ = -(uint)(iVar101 < iVar56);
                    auVar71._12_4_ = -(uint)(iVar103 < iVar58);
                    auVar111 = blendvps(auVar111,auVar94,auVar71);
                    auVar108 = blendvps(auVar108,auVar90,auVar71);
                    uVar104 = (uint)((int)uVar59 < iVar92) * iVar92 |
                              ((int)uVar59 >= iVar92) * uVar59;
                    iVar26 = auVar94._4_4_;
                    uVar105 = (uint)((int)uVar64 < iVar26) * iVar26 |
                              ((int)uVar64 >= iVar26) * uVar64;
                    iVar26 = auVar94._8_4_;
                    uVar106 = (uint)((int)uVar66 < iVar26) * iVar26 |
                              ((int)uVar66 >= iVar26) * uVar66;
                    iVar26 = auVar94._12_4_;
                    uVar107 = (uint)((int)uVar75 < iVar26) * iVar26 |
                              ((int)uVar75 >= iVar26) * uVar75;
                    auVar80._0_4_ =
                         ((int)uVar63 < (int)uVar104) * uVar104 |
                         ((int)uVar63 >= (int)uVar104) * uVar63;
                    auVar80._4_4_ =
                         ((int)uVar65 < (int)uVar105) * uVar105 |
                         ((int)uVar65 >= (int)uVar105) * uVar65;
                    auVar80._8_4_ =
                         ((int)uVar73 < (int)uVar106) * uVar106 |
                         ((int)uVar73 >= (int)uVar106) * uVar73;
                    auVar80._12_4_ =
                         ((int)uVar78 < (int)uVar107) * uVar107 |
                         ((int)uVar78 >= (int)uVar107) * uVar78;
                    puVar3 = (uint *)((long)*ptr_02 + lVar29);
                    *puVar3 = (uint)(iVar50 < iVar67) * iVar67 | (uint)(iVar50 >= iVar67) * iVar50;
                    puVar3[1] = (uint)(iVar54 < iVar74) * iVar74 | (uint)(iVar54 >= iVar74) * iVar54
                    ;
                    puVar3[2] = (uint)(iVar56 < iVar76) * iVar76 | (uint)(iVar56 >= iVar76) * iVar56
                    ;
                    puVar3[3] = (uint)(iVar58 < iVar79) * iVar79 | (uint)(iVar58 >= iVar79) * iVar58
                    ;
                    *(undefined1 (*) [16])((long)*b_00 + lVar29) = auVar112;
                    local_198 = auVar69._0_8_;
                    uStack_190 = auVar69._8_8_;
                    puVar4 = (undefined8 *)((long)*b_01 + lVar29);
                    *puVar4 = local_198;
                    puVar4[1] = uStack_190;
                    local_1f8 = auVar86._0_8_;
                    uStack_1f0 = auVar86._8_8_;
                    puVar4 = (undefined8 *)((long)*b_02 + lVar29);
                    *puVar4 = local_1f8;
                    puVar4[1] = uStack_1f0;
                    auVar69._0_4_ = auVar109._0_4_ + 1;
                    auVar69._4_4_ = auVar109._4_4_ + 1;
                    auVar69._8_4_ = auVar109._8_4_ + 1;
                    auVar69._12_4_ = auVar109._12_4_ + 1;
                    auVar109 = blendvps(auVar69,auVar87,auVar71);
                    uVar104 = (uint)(iVar50 < iVar96) * iVar96 | (uint)(iVar50 >= iVar96) * iVar50;
                    uVar105 = (uint)(iVar54 < iVar99) * iVar99 | (uint)(iVar54 >= iVar99) * iVar54;
                    uVar106 = (uint)(iVar56 < iVar101) * iVar101 |
                              (uint)(iVar56 >= iVar101) * iVar56;
                    uVar107 = (uint)(iVar58 < iVar103) * iVar103 |
                              (uint)(iVar58 >= iVar103) * iVar58;
                    piVar1 = (int *)((long)*ptr + lVar29);
                    iVar60 = *piVar1;
                    iVar26 = piVar1[1];
                    iVar96 = piVar1[2];
                    iVar99 = piVar1[3];
                    piVar1 = (int *)((long)*palVar20 + lVar29);
                    iVar101 = *piVar1;
                    iVar92 = piVar1[1];
                    iVar103 = piVar1[2];
                    iVar91 = piVar1[3];
                    piVar1 = (int *)((long)*ptr_00 + lVar29);
                    iVar50 = *piVar1;
                    iVar54 = piVar1[1];
                    iVar56 = piVar1[2];
                    iVar58 = piVar1[3];
                    piVar1 = (int *)((long)*ptr_01 + lVar29);
                    iVar95 = *piVar1;
                    iVar98 = piVar1[1];
                    iVar100 = piVar1[2];
                    iVar102 = piVar1[3];
                    lVar29 = lVar29 + 0x10;
                    lVar24 = lVar24 + uVar33 * 4;
                  } while (lVar32 != lVar29);
                  uVar107 = 0;
                  do {
                    uVar49 = (uint)(*palVar21)[0];
                    uVar53 = *(uint *)((long)*palVar21 + 4);
                    uVar55 = (uint)(*palVar21)[1];
                    uVar57 = uVar34;
                    if (s2_beg == 0) {
                      uVar57 = ptr_03[uVar36 + 1] - open;
                    }
                    lVar24 = auVar111._8_8_;
                    uVar48 = auVar111._0_8_;
                    auVar111._0_8_ = uVar48 << 0x20;
                    auVar111._8_8_ = lVar24 << 0x20 | uVar48 >> 0x20;
                    lVar24 = auVar108._8_8_;
                    uVar48 = auVar108._0_8_;
                    auVar108._0_8_ = uVar48 << 0x20;
                    auVar108._8_8_ = lVar24 << 0x20 | uVar48 >> 0x20;
                    uVar59 = ptr_03[uVar36];
                    auVar110._0_4_ = auVar109._0_4_;
                    auVar110._4_4_ = auVar110._0_4_;
                    auVar110._8_4_ = auVar109._4_4_;
                    auVar110._12_4_ = auVar109._8_4_;
                    auVar109._8_8_ = auVar110._8_8_;
                    auVar109._0_8_ = (ulong)auVar110._0_4_ << 0x20 | 1;
                    lVar29 = 0;
                    lVar24 = lVar30;
                    uVar64 = uVar104;
                    uVar65 = uVar105;
                    uVar63 = uVar106;
                    do {
                      uVar106 = uVar65;
                      uVar105 = uVar64;
                      uVar104 = uVar57;
                      piVar1 = (int *)((long)pvVar5 + lVar29 + lVar27);
                      uVar59 = uVar59 + *piVar1;
                      uVar49 = uVar49 + piVar1[1];
                      uVar53 = uVar53 + piVar1[2];
                      uVar55 = uVar55 + piVar1[3];
                      piVar1 = (int *)((long)*local_200 + lVar29);
                      iVar26 = *piVar1;
                      iVar96 = piVar1[1];
                      iVar99 = piVar1[2];
                      iVar50 = piVar1[3];
                      uVar57 = (iVar26 < (int)uVar104) * uVar104 |
                               (uint)(iVar26 >= (int)uVar104) * iVar26;
                      uVar64 = (iVar96 < (int)uVar105) * uVar105 |
                               (uint)(iVar96 >= (int)uVar105) * iVar96;
                      uVar65 = (iVar99 < (int)uVar106) * uVar106 |
                               (uint)(iVar99 >= (int)uVar106) * iVar99;
                      uVar66 = (iVar50 < (int)uVar63) * uVar63 |
                               (uint)(iVar50 >= (int)uVar63) * iVar50;
                      puVar3 = (uint *)((long)*local_200 + lVar29);
                      *puVar3 = uVar57;
                      puVar3[1] = uVar64;
                      puVar3[2] = uVar65;
                      puVar3[3] = uVar66;
                      auVar70._0_4_ = -(uint)(uVar57 == uVar59);
                      auVar70._4_4_ = -(uint)(uVar64 == uVar49);
                      auVar70._8_4_ = -(uint)(uVar65 == uVar53);
                      auVar70._12_4_ = -(uint)(uVar66 == uVar55);
                      auVar45._0_4_ = -(uint)((int)uVar104 < iVar26);
                      auVar45._4_4_ = -(uint)((int)uVar105 < iVar96);
                      auVar45._8_4_ = -(uint)((int)uVar106 < iVar99);
                      auVar45._12_4_ = -(uint)((int)uVar63 < iVar50);
                      auVar45 = auVar45 | auVar70;
                      auVar71 = blendvps(auVar111,*(undefined1 (*) [16])((long)*local_210 + lVar29),
                                         auVar45);
                      *(undefined1 (*) [16])((long)*local_210 + lVar29) = auVar71;
                      auVar69 = blendvps(auVar108,*(undefined1 (*) [16])((long)*local_218 + lVar29),
                                         auVar45);
                      *(undefined1 (*) [16])((long)*local_218 + lVar29) = auVar69;
                      auVar86 = blendvps(auVar109,*(undefined1 (*) [16])((long)*local_220 + lVar29),
                                         auVar45);
                      *(undefined1 (*) [16])((long)*local_220 + lVar29) = auVar86;
                      lVar43 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 8);
                      iVar26 = auVar71._0_4_;
                      *(int *)(lVar43 + lVar24) = iVar26;
                      lVar43 = lVar43 + lVar24;
                      uVar9 = extractps(auVar71,1);
                      *(undefined8 *)(lVar31 + lVar43) = uVar9;
                      uVar9 = extractps(auVar71,2);
                      *(undefined8 *)(lVar37 + lVar43) = uVar9;
                      uVar9 = extractps(auVar71,3);
                      *(undefined8 *)(lVar35 + lVar43) = uVar9;
                      lVar43 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x10);
                      iVar96 = auVar69._0_4_;
                      *(int *)(lVar43 + lVar24) = iVar96;
                      lVar43 = lVar43 + lVar24;
                      uVar9 = extractps(auVar69,1);
                      *(undefined8 *)(lVar31 + lVar43) = uVar9;
                      uVar9 = extractps(auVar69,2);
                      *(undefined8 *)(lVar37 + lVar43) = uVar9;
                      uVar9 = extractps(auVar69,3);
                      *(undefined8 *)(lVar35 + lVar43) = uVar9;
                      lVar43 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x18);
                      iVar99 = auVar86._0_4_;
                      *(int *)(lVar43 + lVar24) = iVar99;
                      lVar43 = lVar43 + lVar24;
                      uVar9 = extractps(auVar86,1);
                      *(undefined8 *)(lVar31 + lVar43) = uVar9;
                      uVar9 = extractps(auVar86,2);
                      *(undefined8 *)(lVar37 + lVar43) = uVar9;
                      uVar9 = extractps(auVar86,3);
                      *(undefined8 *)(lVar35 + lVar43) = uVar9;
                      lVar43 = *((ppVar18->field_4).trace)->trace_del_table;
                      *(uint *)(lVar43 + lVar24) = uVar57;
                      lVar43 = lVar43 + lVar24;
                      *(uint *)(lVar31 + lVar43) = uVar64;
                      *(uint *)(lVar37 + lVar43) = uVar65;
                      *(uint *)(lVar35 + lVar43) = uVar66;
                      auVar46._0_4_ = -(uint)((int)(uVar104 - gap) < (int)(uVar57 - open));
                      auVar46._4_4_ = -(uint)((int)(uVar105 - gap) < (int)(uVar64 - open));
                      auVar46._8_4_ = -(uint)((int)(uVar106 - gap) < (int)(uVar65 - open));
                      auVar46._12_4_ = -(uint)((int)(uVar63 - gap) < (int)(uVar66 - open));
                      uVar41 = ((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                                (ushort)((byte)(auVar46._12_4_ >> 7) & 1) << 0xc |
                                (ushort)((byte)(auVar46._12_4_ >> 0xf) & 1) << 0xd |
                                (ushort)((byte)(auVar46._12_4_ >> 0x17) & 1) << 0xe |
                               (ushort)(byte)(auVar46._12_4_ >> 0x1f) << 0xf) ^ 0xffff;
                      if (uVar41 == 0) {
                        iVar50 = 0x27;
                      }
                      else {
                        auVar111 = blendvps(auVar111,auVar71,auVar46);
                        auVar108 = blendvps(auVar108,auVar69,auVar46);
                        auVar112 = blendvps(auVar109,auVar86,auVar46);
                        auVar109._0_4_ = auVar112._0_4_ + 1;
                        auVar109._4_4_ = auVar112._4_4_ + 1;
                        auVar109._8_4_ = auVar112._8_4_ + 1;
                        auVar109._12_4_ = auVar112._12_4_ + 1;
                        puVar3 = (uint *)((long)*ptr + lVar29);
                        uVar59 = *puVar3;
                        uVar49 = puVar3[1];
                        uVar53 = puVar3[2];
                        uVar55 = puVar3[3];
                        iVar50 = 0;
                        uVar104 = uVar104 - gap;
                        uVar105 = uVar105 - gap;
                        uVar106 = uVar106 - gap;
                        uVar63 = uVar63 - gap;
                      }
                      uVar82 = ((int)uVar57 < (int)uVar82) * uVar57 |
                               ((int)uVar57 >= (int)uVar82) * uVar82;
                      uVar83 = ((int)uVar64 < (int)uVar83) * uVar64 |
                               ((int)uVar64 >= (int)uVar83) * uVar83;
                      uVar84 = ((int)uVar65 < (int)uVar84) * uVar65 |
                               ((int)uVar65 >= (int)uVar84) * uVar84;
                      uVar85 = ((int)uVar66 < (int)uVar85) * uVar66 |
                               ((int)uVar66 >= (int)uVar85) * uVar85;
                      iVar54 = auVar80._0_4_;
                      uVar57 = (iVar54 < (int)uVar57) * uVar57 |
                               (uint)(iVar54 >= (int)uVar57) * iVar54;
                      iVar54 = auVar80._4_4_;
                      uVar64 = (iVar54 < (int)uVar64) * uVar64 |
                               (uint)(iVar54 >= (int)uVar64) * iVar54;
                      iVar54 = auVar80._8_4_;
                      iVar56 = auVar80._12_4_;
                      uVar65 = (iVar54 < (int)uVar65) * uVar65 |
                               (uint)(iVar54 >= (int)uVar65) * iVar54;
                      uVar66 = (iVar56 < (int)uVar66) * uVar66 |
                               (uint)(iVar56 >= (int)uVar66) * iVar56;
                      uVar57 = (uint)((int)uVar57 < iVar26) * iVar26 |
                               ((int)uVar57 >= iVar26) * uVar57;
                      iVar26 = auVar71._4_4_;
                      uVar64 = (uint)((int)uVar64 < iVar26) * iVar26 |
                               ((int)uVar64 >= iVar26) * uVar64;
                      iVar26 = auVar71._8_4_;
                      uVar65 = (uint)((int)uVar65 < iVar26) * iVar26 |
                               ((int)uVar65 >= iVar26) * uVar65;
                      iVar26 = auVar71._12_4_;
                      uVar66 = (uint)((int)uVar66 < iVar26) * iVar26 |
                               ((int)uVar66 >= iVar26) * uVar66;
                      uVar73 = (uint)(iVar96 < iVar99) * iVar99 | (uint)(iVar96 >= iVar99) * iVar96;
                      iVar26 = auVar86._4_4_;
                      iVar96 = auVar69._4_4_;
                      uVar75 = (uint)(iVar96 < iVar26) * iVar26 | (uint)(iVar96 >= iVar26) * iVar96;
                      iVar26 = auVar86._8_4_;
                      iVar96 = auVar69._8_4_;
                      iVar99 = auVar69._12_4_;
                      uVar78 = (uint)(iVar96 < iVar26) * iVar26 | (uint)(iVar96 >= iVar26) * iVar96;
                      iVar26 = auVar86._12_4_;
                      uVar89 = (uint)(iVar99 < iVar26) * iVar26 | (uint)(iVar99 >= iVar26) * iVar99;
                      auVar80._0_4_ =
                           ((int)uVar73 < (int)uVar57) * uVar57 |
                           ((int)uVar73 >= (int)uVar57) * uVar73;
                      auVar80._4_4_ =
                           ((int)uVar75 < (int)uVar64) * uVar64 |
                           ((int)uVar75 >= (int)uVar64) * uVar75;
                      auVar80._8_4_ =
                           ((int)uVar78 < (int)uVar65) * uVar65 |
                           ((int)uVar78 >= (int)uVar65) * uVar78;
                      auVar80._12_4_ =
                           ((int)uVar89 < (int)uVar66) * uVar66 |
                           ((int)uVar89 >= (int)uVar66) * uVar89;
                      if (uVar41 == 0) goto LAB_006ce045;
                      lVar29 = lVar29 + 0x10;
                      lVar24 = lVar24 + uVar33 * 4;
                      uVar57 = uVar104;
                      uVar64 = uVar105;
                      uVar65 = uVar106;
                    } while (lVar32 != lVar29);
                    iVar50 = 0;
LAB_006ce045:
                  } while ((iVar50 == 0) && (bVar44 = uVar107 < 3, uVar107 = uVar107 + 1, bVar44));
                  palVar21 = local_200 + uVar25;
                  iVar96 = (int)(*palVar21)[0];
                  iVar99 = *(int *)((long)*palVar21 + 4);
                  iVar50 = (int)(*palVar21)[1];
                  iVar54 = *(int *)((long)*palVar21 + 0xc);
                  local_98 = auVar51._0_4_;
                  iStack_94 = auVar51._4_4_;
                  iStack_90 = auVar51._8_4_;
                  iStack_8c = auVar51._12_4_;
                  auVar47._0_4_ = -(uint)(local_98 < iVar96);
                  auVar47._4_4_ = -(uint)(iStack_94 < iVar99);
                  auVar47._8_4_ = -(uint)(iStack_90 < iVar50);
                  auVar47._12_4_ = -(uint)(iStack_8c < iVar54);
                  auVar88 = blendvps(auVar88,(undefined1  [16])local_210[uVar25],auVar47);
                  auVar72 = blendvps(auVar72,(undefined1  [16])local_218[uVar25],auVar47);
                  auVar61 = blendvps(auVar61,(undefined1  [16])local_220[uVar25],auVar47);
                  iVar26 = auVar61._12_4_;
                  auVar12._4_4_ = -(uint)(uVar23 == 2);
                  auVar12._0_4_ = -(uint)(uVar23 == 3);
                  auVar12._8_4_ = -(uint)(uVar23 == 1);
                  auVar12._12_4_ = -(uint)(uVar23 == 0);
                  iVar56 = movmskps(uVar25 * 0x10,auVar47 & auVar12);
                  if (iVar56 != 0) {
                    local_240 = (int)uVar36;
                  }
                  auVar51._0_4_ =
                       (uint)(iVar96 < local_98) * local_98 | (uint)(iVar96 >= local_98) * iVar96;
                  auVar51._4_4_ =
                       (uint)(iVar99 < iStack_94) * iStack_94 | (uint)(iVar99 >= iStack_94) * iVar99
                  ;
                  auVar51._8_4_ =
                       (uint)(iVar50 < iStack_90) * iStack_90 | (uint)(iVar50 >= iStack_90) * iVar50
                  ;
                  auVar51._12_4_ =
                       (uint)(iVar54 < iStack_8c) * iStack_8c | (uint)(iVar54 >= iStack_8c) * iVar54
                  ;
                  uVar36 = uVar36 + 1;
                  lVar30 = lVar30 + 4;
                  local_1f8 = local_210;
                  palVar21 = local_218;
                  palVar22 = local_220;
                  palVar19 = local_200;
                  if (uVar36 == uVar38) {
                    if (s2_end == 0) {
                      iVar96 = 0;
                      iVar99 = 0;
                      iVar26 = 0;
                      local_244 = uVar16;
                    }
                    else {
                      if (iVar13 < 3) {
                        auVar109 = auVar51;
                        uVar34 = 1;
                        if (1 < (int)uVar23) {
                          uVar34 = uVar23;
                        }
                        do {
                          auVar52._0_8_ = auVar109._0_8_ << 0x20;
                          auVar52._8_8_ = auVar109._8_8_ << 0x20 | auVar109._0_8_ >> 0x20;
                          auVar51._12_4_ = auVar109._8_4_;
                          lVar31 = auVar88._8_8_;
                          uVar33 = auVar88._0_8_;
                          auVar88._0_8_ = uVar33 << 0x20;
                          auVar88._8_8_ = lVar31 << 0x20 | uVar33 >> 0x20;
                          lVar31 = auVar72._8_8_;
                          uVar33 = auVar72._0_8_;
                          auVar72._0_8_ = uVar33 << 0x20;
                          auVar72._8_8_ = lVar31 << 0x20 | uVar33 >> 0x20;
                          auVar62._0_8_ = auVar61._0_8_ << 0x20;
                          auVar62._8_8_ = auVar61._8_8_ << 0x20 | auVar61._0_8_ >> 0x20;
                          iVar26 = auVar61._8_4_;
                          uVar34 = uVar34 - 1;
                          auVar109 = auVar52;
                          auVar61 = auVar62;
                        } while (uVar34 != 0);
                      }
                      iVar96 = (int)(auVar88._8_8_ >> 0x20);
                      iVar99 = (int)(auVar72._8_8_ >> 0x20);
                      local_244 = auVar51._12_4_;
                    }
                    iVar50 = iVar42;
                    if ((s1_end != 0) && ((uVar77 & 0x7ffffffc) != 0)) {
                      uVar33 = 0;
                      do {
                        iVar54 = ((uint)uVar33 & 3) * uVar39 + ((uint)(uVar33 >> 2) & 0x3fffffff);
                        if (iVar54 < (int)uVar17) {
                          uVar34 = *(uint *)((long)*local_200 + uVar33 * 4);
                          iVar56 = iVar15;
                          if (((int)local_244 < (int)uVar34) ||
                             (((uVar34 == local_244 && (local_240 == iVar15)) &&
                              (uVar34 = local_244, iVar56 = local_240, iVar54 < iVar50)))) {
                            iVar96 = *(int *)((long)*local_210 + uVar33 * 4);
                            iVar99 = *(int *)((long)*local_218 + uVar33 * 4);
                            iVar26 = *(int *)((long)*local_220 + uVar33 * 4);
                            iVar50 = iVar54;
                            local_244 = uVar34;
                            local_240 = iVar56;
                          }
                        }
                        uVar33 = uVar33 + 1;
                      } while ((uVar39 & 0x1fffffff) << 2 != (int)uVar33);
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      uVar33 = local_200[uVar25][0];
                      uVar77 = local_200[uVar25][1];
                      uVar40 = local_210[uVar25][0];
                      uVar38 = local_210[uVar25][1];
                      uVar36 = local_218[uVar25][0];
                      auVar72._8_8_ = local_218[uVar25][1];
                      auVar88._8_8_ = local_220[uVar25][0];
                      uVar48 = local_220[uVar25][1];
                      if (iVar13 < 3) {
                        uVar17 = 1;
                        if (1 < (int)uVar23) {
                          uVar17 = uVar23;
                        }
                        do {
                          uVar77 = uVar77 << 0x20 | uVar33 >> 0x20;
                          uVar38 = uVar38 << 0x20 | uVar40 >> 0x20;
                          auVar72._8_8_ = auVar72._8_8_ << 0x20 | uVar36 >> 0x20;
                          uVar48 = uVar48 << 0x20 | auVar88._8_8_ >> 0x20;
                          uVar17 = uVar17 - 1;
                          uVar33 = uVar33 << 0x20;
                          uVar40 = uVar40 << 0x20;
                          uVar36 = uVar36 << 0x20;
                          auVar88._8_8_ = auVar88._8_8_ << 0x20;
                        } while (uVar17 != 0);
                      }
                      local_244 = (uint)(uVar77 >> 0x20);
                      iVar96 = (int)(uVar38 >> 0x20);
                      iVar99 = (int)(auVar72._8_8_ >> 0x20);
                      iVar26 = (int)(uVar48 >> 0x20);
                      iVar50 = iVar42;
                      local_240 = iVar15;
                    }
                    auVar61._0_4_ = -(uint)((int)uVar82 < (int)uVar16);
                    auVar61._4_4_ = -(uint)((int)uVar83 < (int)uVar16);
                    auVar61._8_4_ = -(uint)((int)uVar84 < (int)uVar16);
                    auVar61._12_4_ = -(uint)((int)uVar85 < (int)uVar16);
                    auVar81._0_4_ = -(uint)((int)uVar14 < (int)auVar80._0_4_);
                    auVar81._4_4_ = -(uint)((int)uVar14 < (int)auVar80._4_4_);
                    auVar81._8_4_ = -(uint)((int)uVar14 < (int)auVar80._8_4_);
                    auVar81._12_4_ = -(uint)((int)uVar14 < (int)auVar80._12_4_);
                    iVar13 = movmskps(s1_end,auVar81 | auVar61);
                    if (iVar13 != 0) {
                      *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
                      local_244 = 0;
                      iVar96 = 0;
                      iVar99 = 0;
                      iVar26 = 0;
                      local_240 = 0;
                      iVar50 = 0;
                    }
                    ppVar18->score = local_244;
                    ppVar18->end_query = iVar50;
                    ppVar18->end_ref = local_240;
                    ((ppVar18->field_4).stats)->matches = iVar96;
                    ((ppVar18->field_4).stats)->similar = iVar99;
                    ((ppVar18->field_4).stats)->length = iVar26;
                    parasail_free(ptr_03);
                    parasail_free(b_02);
                    parasail_free(b_01);
                    parasail_free(b_00);
                    parasail_free(ptr_02);
                    parasail_free(ptr_01);
                    parasail_free(local_220);
                    parasail_free(ptr_00);
                    parasail_free(local_218);
                    parasail_free(palVar20);
                    parasail_free(local_210);
                    parasail_free(ptr);
                    parasail_free(local_200);
                    return ppVar18;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile32.score;
    vProfileM = (__m128i*)profile->profile32.matches;
    vProfileS = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);
        vHM = _mm_slli_si128(vHM, 4);
        vHS = _mm_slli_si128(vHS, 4);
        vHL = _mm_slli_si128(vHL, 4);

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi32(vH_dag, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi32(vH, vH_dag);
            case2 = _mm_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi32(vEL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vFL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 4);
            vF = _mm_slli_si128(vF, 4);
            vFM = _mm_slli_si128(vFM, 4);
            vFS = _mm_slli_si128(vFS, 4);
            vFL = _mm_slli_si128(vFL, 4);
            vHp = _mm_insert_epi32(vHp, boundary[j], 0);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            vFL = _mm_insert_epi32(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi32(vH, vHp);
                case2 = _mm_cmpeq_epi32(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi32(vFL, vOne),
                        _mm_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi32(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
        result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
            vMaxHM = _mm_slli_si128(vMaxHM, 4);
            vMaxHS = _mm_slli_si128(vMaxHS, 4);
            vMaxHL = _mm_slli_si128(vMaxHL, 4);
        }
        end_query = s1Len-1;
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        matches = (int32_t) _mm_extract_epi32(vMaxHM, 3);
        similar = (int32_t) _mm_extract_epi32(vMaxHS, 3);
        length = (int32_t) _mm_extract_epi32(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t *m = (int32_t*)pvHMStore;
        int32_t *s = (int32_t*)pvHSStore;
        int32_t *l = (int32_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}